

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexUtils.cpp
# Opt level: O2

bool Ptex::v2_2::PtexUtils::isConstant(void *data,int stride,int ures,int vres,int pixelSize)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  size_t __n;
  
  iVar2 = 0;
  pvVar3 = (void *)((long)data + (long)stride);
  do {
    iVar2 = iVar2 + 1;
    if (vres <= iVar2) {
      __n = (size_t)pixelSize;
      iVar2 = 0;
      pvVar3 = (void *)((long)data + __n);
      do {
        iVar2 = iVar2 + 1;
        if (ures <= iVar2) {
          return ures <= iVar2;
        }
        iVar1 = bcmp(data,pvVar3,__n);
        pvVar3 = (void *)((long)pvVar3 + __n);
      } while (iVar1 == 0);
      return ures <= iVar2;
    }
    iVar1 = bcmp(data,pvVar3,(long)(pixelSize * ures));
    pvVar3 = (void *)((long)pvVar3 + (long)stride);
  } while (iVar1 == 0);
  return false;
}

Assistant:

bool isConstant(const void* data, int stride, int ures, int vres,
                int pixelSize)
{
    int rowlen = pixelSize * ures;
    const char* p = (const char*) data + stride;

    // compare each row with the first
    for (int i = 1; i < vres; i++, p += stride)
        if (0 != memcmp(data, p, rowlen)) return 0;

    // make sure first row is constant
    p = (const char*) data + pixelSize;
    for (int i = 1; i < ures; i++, p += pixelSize)
        if (0 != memcmp(data, p, pixelSize)) return 0;

    return 1;
}